

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZXAlgorithms.h
# Opt level: O3

char ZXing::ToDigit<char>(int i)

{
  long *plVar1;
  uint *local_38;
  long local_30;
  uint local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  
  if ((uint)i < 10) {
    return (byte)i | 0x30;
  }
  plVar1 = (long *)__cxa_allocate_exception(0x30);
  local_38 = &local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"Invalid digit value","");
  *plVar1 = (long)(plVar1 + 2);
  if (local_38 == &local_28) {
    *(uint *)(plVar1 + 2) = local_28;
    *(undefined4 *)((long)plVar1 + 0x14) = uStack_24;
    *(undefined4 *)(plVar1 + 3) = uStack_20;
    *(undefined4 *)((long)plVar1 + 0x1c) = uStack_1c;
  }
  else {
    *plVar1 = (long)local_38;
    plVar1[2] = CONCAT44(uStack_24,local_28);
  }
  plVar1[1] = local_30;
  local_30 = 0;
  local_28 = local_28 & 0xffffff00;
  plVar1[4] = (long)"src/ZXAlgorithms.h";
  *(undefined2 *)(plVar1 + 5) = 0x67;
  *(undefined1 *)((long)plVar1 + 0x2a) = 1;
  local_38 = &local_28;
  __cxa_throw(plVar1,&Error::typeinfo,Error::~Error);
}

Assistant:

T ToDigit(int i)
{
	if (i < 0 || i > 9)
		throw FormatError("Invalid digit value");
	return static_cast<T>('0' + i);
}